

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# joint.cpp
# Opt level: O2

void __thiscall CMU462::DynamicScene::Joint::unkeyframe(Joint *this,double t)

{
  pointer ppJVar1;
  pointer ppJVar2;
  
  Spline<CMU462::Vector3D>::removeKnot(&(this->super_SceneObject).positions,t,0.1);
  Spline<CMU462::Vector3D>::removeKnot(&(this->super_SceneObject).rotations,t,0.1);
  Spline<CMU462::Vector3D>::removeKnot(&(this->super_SceneObject).scales,t,0.1);
  ppJVar1 = (this->kids).
            super__Vector_base<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppJVar2 = (this->kids).
                 super__Vector_base<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppJVar2 != ppJVar1;
      ppJVar2 = ppJVar2 + 1) {
    unkeyframe(*ppJVar2,t);
  }
  return;
}

Assistant:

void Joint::unkeyframe(double t) {
     positions.removeKnot(t, 0.1);
     rotations.removeKnot(t, 0.1);
     scales.removeKnot(t, 0.1);
     for (Joint *j : kids) j->unkeyframe(t);
   }